

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txindex.cpp
# Opt level: O1

bool __thiscall
TxIndex::FindTx(TxIndex *this,uint256 *tx_hash,uint256 *block_hash,CTransactionRef *tx)

{
  long lVar1;
  element_type *peVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  long in_FS_OFFSET;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  CDiskTxPos postx;
  AutoFile file;
  undefined1 local_98 [16];
  uchar local_88 [8];
  uchar auStack_80 [8];
  CBlockHeader header;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  postx.super_FlatFilePos.nFile = -1;
  postx.super_FlatFilePos.nPos = 0;
  postx.nTxOffset = 0;
  header.nVersion._0_1_ = 0x74;
  header._1_8_ = *(undefined8 *)(tx_hash->super_base_blob<256U>).m_data._M_elems;
  uVar3 = *(undefined8 *)((tx_hash->super_base_blob<256U>).m_data._M_elems + 8);
  header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._13_8_ =
       *(undefined8 *)((tx_hash->super_base_blob<256U>).m_data._M_elems + 0x10);
  uVar4 = *(undefined8 *)((tx_hash->super_base_blob<256U>).m_data._M_elems + 0x18);
  header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._5_7_ = SUB87(uVar3,0);
  header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = (uchar)((ulong)uVar3 >> 0x38);
  header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._21_7_ = SUB87(uVar4,0);
  header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1c] = (uchar)((ulong)uVar4 >> 0x38);
  bVar5 = CDBWrapper::Read<std::pair<unsigned_char,uint256>,CDiskTxPos>
                    ((CDBWrapper *)
                     (this->m_db)._M_t.
                     super___uniq_ptr_impl<TxIndex::DB,_std::default_delete<TxIndex::DB>_>._M_t.
                     super__Tuple_impl<0UL,_TxIndex::DB_*,_std::default_delete<TxIndex::DB>_>.
                     super__Head_base<0UL,_TxIndex::DB_*,_false>._M_head_impl,
                     (pair<unsigned_char,_uint256> *)&header,&postx);
  if (!bVar5) {
    bVar5 = false;
    goto LAB_00486848;
  }
  ::node::BlockManager::OpenBlockFile
            (&file,((this->super_BaseIndex).m_chainstate)->m_blockman,&postx.super_FlatFilePos,true)
  ;
  if (file.m_file == (FILE *)0x0) {
    logging_function_00._M_str = "FindTx";
    logging_function_00._M_len = 6;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/index/txindex.cpp"
    ;
    source_file_00._M_len = 0x61;
    LogPrintFormatInternal<char[7]>
              (logging_function_00,source_file_00,0x54,ALL,Error,(ConstevalFormatString<1U>)0x7ebb84
               ,(char (*) [7])"FindTx");
LAB_00486814:
    bVar5 = false;
  }
  else {
    header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    header.nTime = 0;
    header.nBits = 0;
    header.nNonce = 0;
    header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    header._33_15_ = SUB1615((undefined1  [16])0x0,1);
    header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    header.nVersion._0_1_ = 0;
    header._1_8_ = 0;
    header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    ActionUnserialize::
    SerReadWriteMany<AutoFile,int&,uint256&,uint256&,unsigned_int&,unsigned_int&,unsigned_int&>
              (&file,&header.nVersion,&header.hashPrevBlock,&header.hashMerkleRoot,&header.nTime,
               &header.nBits,&header.nNonce);
    AutoFile::seek(&file,(ulong)postx.nTxOffset,1);
    local_98._0_8_ = &::TX_WITH_WITNESS;
    local_98._8_8_ = &file;
    Unserialize<ParamsStream<AutoFile&,TransactionSerParams>,CTransaction>
              ((ParamsStream<AutoFile_&,_TransactionSerParams> *)local_98,tx);
    peVar2 = (tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    auVar7[0] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[0] ==
                 (peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0]);
    auVar7[1] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[1] ==
                 *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 1
                           ));
    auVar7[2] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[2] ==
                 *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 2
                           ));
    auVar7[3] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[3] ==
                 *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 3
                           ));
    auVar7[4] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[4] ==
                 *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 4
                           ));
    auVar7[5] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[5] ==
                 *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 5
                           ));
    auVar7[6] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[6] ==
                 *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 6
                           ));
    auVar7[7] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[7] ==
                 *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 7
                           ));
    auVar7[8] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[8] ==
                 *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8
                           ));
    auVar7[9] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[9] ==
                 *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 9
                           ));
    auVar7[10] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[10] ==
                  *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                            10));
    auVar7[0xb] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[0xb] ==
                   *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                             0xb));
    auVar7[0xc] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[0xc] ==
                   *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                             0xc));
    auVar7[0xd] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[0xd] ==
                   *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                             0xd));
    auVar7[0xe] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[0xe] ==
                   *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                             0xe));
    auVar7[0xf] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[0xf] ==
                   *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                             0xf));
    auVar6[0] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[0x10] ==
                 *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                           0x10));
    auVar6[1] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[0x11] ==
                 *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                           0x11));
    auVar6[2] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[0x12] ==
                 *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                           0x12));
    auVar6[3] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[0x13] ==
                 *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                           0x13));
    auVar6[4] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[0x14] ==
                 *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                           0x14));
    auVar6[5] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[0x15] ==
                 *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                           0x15));
    auVar6[6] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[0x16] ==
                 *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                           0x16));
    auVar6[7] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[0x17] ==
                 *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                           0x17));
    auVar6[8] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[0x18] ==
                 *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                           0x18));
    auVar6[9] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[0x19] ==
                 *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                           0x19));
    auVar6[10] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[0x1a] ==
                  *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                            0x1a));
    auVar6[0xb] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[0x1b] ==
                   *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                             0x1b));
    auVar6[0xc] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[0x1c] ==
                   *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                             0x1c));
    auVar6[0xd] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[0x1d] ==
                   *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                             0x1d));
    auVar6[0xe] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[0x1e] ==
                   *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                             0x1e));
    auVar6[0xf] = -((tx_hash->super_base_blob<256U>).m_data._M_elems[0x1f] ==
                   *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                             0x1f));
    auVar6 = auVar6 & auVar7;
    if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar6[0xf] >> 7) << 0xf) != 0xffff) {
      logging_function._M_str = "FindTx";
      logging_function._M_len = 6;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/index/txindex.cpp"
      ;
      source_file._M_len = 0x61;
      LogPrintFormatInternal<char[7]>
                (logging_function,source_file,0x61,ALL,Error,(ConstevalFormatString<1U>)0x82d4a6,
                 (char (*) [7])"FindTx");
      goto LAB_00486814;
    }
    CBlockHeader::GetHash((uint256 *)local_98,&header);
    *(uchar (*) [8])((block_hash->super_base_blob<256U>).m_data._M_elems + 0x10) = local_88;
    *(uchar (*) [8])((block_hash->super_base_blob<256U>).m_data._M_elems + 0x18) = auStack_80;
    *(undefined8 *)(block_hash->super_base_blob<256U>).m_data._M_elems = local_98._0_8_;
    *(undefined8 *)((block_hash->super_base_blob<256U>).m_data._M_elems + 8) = local_98._8_8_;
    bVar5 = true;
  }
  AutoFile::~AutoFile(&file);
LAB_00486848:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool TxIndex::FindTx(const uint256& tx_hash, uint256& block_hash, CTransactionRef& tx) const
{
    CDiskTxPos postx;
    if (!m_db->ReadTxPos(tx_hash, postx)) {
        return false;
    }

    AutoFile file{m_chainstate->m_blockman.OpenBlockFile(postx, true)};
    if (file.IsNull()) {
        LogError("%s: OpenBlockFile failed\n", __func__);
        return false;
    }
    CBlockHeader header;
    try {
        file >> header;
        file.seek(postx.nTxOffset, SEEK_CUR);
        file >> TX_WITH_WITNESS(tx);
    } catch (const std::exception& e) {
        LogError("%s: Deserialize or I/O error - %s\n", __func__, e.what());
        return false;
    }
    if (tx->GetHash() != tx_hash) {
        LogError("%s: txid mismatch\n", __func__);
        return false;
    }
    block_hash = header.GetHash();
    return true;
}